

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

string * __thiscall
pbrt::TriangleMesh::ToString_abi_cxx11_(string *__return_storage_ptr__,TriangleMesh *this)

{
  int *args_2;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string np;
  span<const_int> local_90;
  span<const_pbrt::Point2<float>_> local_80;
  span<const_pbrt::Vector3<float>_> local_70;
  span<const_pbrt::Normal3<float>_> local_60;
  span<const_pbrt::Point3<float>_> local_50;
  span<const_int> local_40;
  
  np._M_dataplus._M_p = (pointer)&np.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&np,"(nullptr)","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  if (this->vertexIndices == (int *)0x0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,np._M_dataplus._M_p,np._M_dataplus._M_p + np._M_string_length);
  }
  else {
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_40.n = (long)this->nTriangles * 3;
    local_40.ptr = this->vertexIndices;
    detail::stringPrintfRecursive<pstd::span<int_const>>(&local_f0,"%s",&local_40);
  }
  local_50.ptr = this->p;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  if (local_50.ptr == (Point3f *)0x0) {
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  args_2 = &this->nVertices;
  local_50.n = (size_t)*args_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pstd::span<pbrt::Point3<float>const>>(&local_110,"%s",&local_50);
  local_60.ptr = this->n;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  if (local_60.ptr == (Normal3f *)0x0) {
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  local_60.n = (size_t)*args_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pstd::span<pbrt::Normal3<float>const>>(&local_130,"%s",&local_60);
  local_70.ptr = this->s;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  if (local_70.ptr != (Vector3f *)0x0) {
    local_70.n = (size_t)*args_2;
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<pstd::span<pbrt::Vector3<float>const>>(&local_150,"%s",&local_70);
    local_80.ptr = this->uv;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    if (local_80.ptr == (Point2f *)0x0) {
      std::__throw_logic_error("basic_string::_M_construct null not valid");
    }
    local_80.n = (size_t)*args_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<pstd::span<pbrt::Point2<float>const>>(&local_d0,"%s",&local_80);
    local_90.ptr = this->faceIndices;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    if (local_90.ptr != (int *)0x0) {
      local_90.n = (size_t)this->nTriangles;
      local_170._M_string_length = 0;
      local_170.field_2._M_local_buf[0] = '\0';
      detail::stringPrintfRecursive<pstd::span<int_const>>(&local_170,"%s",&local_90);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      detail::
      stringPrintfRecursive<bool_const&,bool_const&,int_const&,int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (__return_storage_ptr__,
                 "[ TriangleMesh reverseOrientation: %s transformSwapsHandedness: %s nTriangles: %d nVertices: %d vertexIndices: %s p: %s n: %s s: %s uv: %s faceIndices: %s ]"
                 ,&this->reverseOrientation,&this->transformSwapsHandedness,&this->nTriangles,args_2
                 ,&local_f0,&local_110,&local_130,&local_150,&local_d0,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,
                        CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                                 local_170.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,
                        CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                 local_150.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                 local_130.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,
                        CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                 local_f0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)np._M_dataplus._M_p != &np.field_2) {
        operator_delete(np._M_dataplus._M_p,np.field_2._M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  std::__throw_logic_error("basic_string::_M_construct null not valid");
}

Assistant:

std::string TriangleMesh::ToString() const {
    std::string np = "(nullptr)";
    return StringPrintf(
        "[ TriangleMesh reverseOrientation: %s transformSwapsHandedness: %s "
        "nTriangles: %d nVertices: %d vertexIndices: %s p: %s n: %s "
        "s: %s uv: %s faceIndices: %s ]",
        reverseOrientation, transformSwapsHandedness, nTriangles, nVertices,
        vertexIndices ? StringPrintf("%s", pstd::MakeSpan(vertexIndices, 3 * nTriangles))
                      : np,
        p ? StringPrintf("%s", pstd::MakeSpan(p, nVertices)) : nullptr,
        n ? StringPrintf("%s", pstd::MakeSpan(n, nVertices)) : nullptr,
        s ? StringPrintf("%s", pstd::MakeSpan(s, nVertices)) : nullptr,
        uv ? StringPrintf("%s", pstd::MakeSpan(uv, nVertices)) : nullptr,
        faceIndices ? StringPrintf("%s", pstd::MakeSpan(faceIndices, nTriangles))
                    : nullptr);
}